

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::Constraint::setLowerBound(Constraint *this,VectorDynSize *lowerBound)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = iDynTree::VectorDynSize::size();
  sVar1 = this->m_constraintSize;
  if (sVar2 == sVar1) {
    iDynTree::VectorDynSize::operator=(&this->m_lowerBound,lowerBound);
    this->m_isLowerBounded = true;
  }
  else {
    iDynTree::reportError
              ("Constraint","setLowerBound",
               "The lowerBound dimension is not coherent with the constraint size.");
  }
  return sVar2 == sVar1;
}

Assistant:

bool Constraint::setLowerBound(const VectorDynSize &lowerBound)
        {
            if (lowerBound.size() != m_constraintSize){
                reportError("Constraint", "setLowerBound", "The lowerBound dimension is not coherent with the constraint size.");
                return false;
            }
            m_lowerBound = lowerBound;
            m_isLowerBounded = true;
            return true;
        }